

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O1

void write2_cb(uv_write_t *req,int status)

{
  int iVar1;
  
  if (status != 0) {
    write2_cb_cold_1();
    iVar1 = uv_is_closing((uv_handle_t *)req);
    if (iVar1 != 0) {
      return;
    }
    uv_close((uv_handle_t *)req,(uv_close_cb)0x0);
    return;
  }
  write2_cb_called = write2_cb_called + 1;
  if ((write2_cb_called == 2) && (is_in_process != 0)) {
    uv_close(&ctx2.recv.handle,(uv_close_cb)0x0);
    uv_close(&ctx2.recv2.handle,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&ctx2.channel,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&ctx2,(uv_close_cb)0x0);
    return;
  }
  return;
}

Assistant:

static void write2_cb(uv_write_t* req, int status) {
  ASSERT(status == 0);

  /* After two successful writes in the child process, allow the child
   * process to be closed. */
  if (++write2_cb_called == 2 && (is_child_process || is_in_process)) {
    uv_close(&ctx2.recv.handle, NULL);
    uv_close(&ctx2.recv2.handle, NULL);
    uv_close((uv_handle_t*)&ctx2.channel, NULL);
    uv_close((uv_handle_t*)&ctx2.listen, NULL);
  }
}